

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O0

void __thiscall
glslang::TReflectionTraverser::TReflectionTraverser
          (TReflectionTraverser *this,TIntermediate *i,TReflection *r)

{
  TReflection *r_local;
  TIntermediate *i_local;
  TReflectionTraverser *this_local;
  
  TIntermTraverser::TIntermTraverser(&this->super_TIntermTraverser,true,false,false,false);
  (this->super_TIntermTraverser)._vptr_TIntermTraverser =
       (_func_int **)&PTR__TReflectionTraverser_013aa3f0;
  this->intermediate = i;
  this->reflection = r;
  std::
  set<const_TIntermNode_*,_std::less<const_TIntermNode_*>,_std::allocator<const_TIntermNode_*>_>::
  set(&this->processedDerefs);
  this->updateStageMasks = true;
  return;
}

Assistant:

TReflectionTraverser(const TIntermediate& i, TReflection& r) :
	                     TIntermTraverser(), intermediate(i), reflection(r), updateStageMasks(true) { }